

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

int Gia_ManSuppSize(Gia_Man_t *p,int *pNodes,int nNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  uVar7 = 0;
  uVar5 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar5 = uVar7;
  }
  iVar6 = 0;
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    pGVar2 = Gia_ManObj(p,pNodes[uVar7]);
    uVar3 = *(ulong *)pGVar2 & 0x1fffffff;
    uVar4 = 0;
    if (uVar3 != 0x1fffffff) {
      uVar4 = -uVar3;
    }
    iVar1 = Gia_ManSuppSize_rec(p,pGVar2 + (uVar4 & (long)(int)*(ulong *)pGVar2 >> 0x1f));
    iVar6 = iVar6 + iVar1;
  }
  return iVar6;
}

Assistant:

int Gia_ManSuppSize( Gia_Man_t * p, int * pNodes, int nNodes )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0; 
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Counter += Gia_ManSuppSize_rec( p, Gia_ObjFanin0(pObj) );
        else
            Counter += Gia_ManSuppSize_rec( p, pObj );
    }
    return Counter;
}